

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkLogicToNetlist(Abc_Ntk_t *pNtk)

{
  int iVar1;
  char *pcVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Abc_Obj_t *pFanin_00;
  Abc_Obj_t *pAVar5;
  Abc_Ntk_t *pAVar6;
  int local_40;
  int local_3c;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pDriver;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNetlist.c"
                  ,0x99,"Abc_Ntk_t *Abc_NtkLogicToNetlist(Abc_Ntk_t *)");
  }
  Abc_NtkCleanup(pNtk,0);
  Abc_NtkCheckUniqueCiNames(pNtk);
  Abc_NtkCheckUniqueCoNames(pNtk);
  Abc_NtkCheckUniqueCioNames(pNtk);
  iVar1 = Abc_NtkLogicHasSimpleCos(pNtk);
  if (iVar1 == 0) {
    pcVar2 = Abc_FrameReadFlag("silentmode");
    if (pcVar2 == (char *)0x0) {
      printf("Abc_NtkLogicToNetlist() warning: The network is converted to have simple COs.\n");
    }
    Abc_NtkLogicMakeSimpleCos(pNtk,0);
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_NETLIST,pNtk->ntkFunc);
  for (local_3c = 0; iVar1 = Abc_NtkCiNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = Abc_NtkCi(pNtk,local_3c);
    pcVar2 = Abc_ObjName(pAVar3);
    pAVar5 = Abc_NtkFindOrCreateNet(pNtk_00,pcVar2);
    Abc_ObjAddFanin(pAVar5,(pAVar3->field_6).pCopy);
    (((pAVar3->field_6).pCopy)->field_6).pCopy = pAVar5;
  }
  for (local_3c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar3 = Abc_NtkObj(pNtk,local_3c);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar3), iVar1 != 0)) {
      Abc_NtkDupObj(pNtk_00,pAVar3,0);
    }
  }
  local_3c = 0;
  do {
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 <= local_3c) {
      for (local_3c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_3c < iVar1; local_3c = local_3c + 1
          ) {
        pAVar3 = Abc_NtkObj(pNtk,local_3c);
        if (((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar3), iVar1 != 0)) &&
           ((((pAVar3->field_6).pCopy)->field_6).pTemp == (void *)0x0)) {
          pcVar2 = Abc_ObjName(pAVar3);
          pAVar5 = Abc_NtkFindOrCreateNet(pNtk_00,pcVar2);
          Abc_ObjAddFanin(pAVar5,(pAVar3->field_6).pCopy);
          (((pAVar3->field_6).pCopy)->field_6).pCopy = pAVar5;
        }
      }
      for (local_3c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_3c < iVar1; local_3c = local_3c + 1
          ) {
        pAVar3 = Abc_NtkObj(pNtk,local_3c);
        if ((pAVar3 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsNode(pAVar3), iVar1 != 0)) {
          for (local_40 = 0; iVar1 = Abc_ObjFaninNum(pAVar3), local_40 < iVar1;
              local_40 = local_40 + 1) {
            pAVar5 = Abc_ObjFanin(pAVar3,local_40);
            Abc_ObjAddFanin((pAVar3->field_6).pCopy,(((pAVar5->field_6).pCopy)->field_6).pCopy);
          }
        }
      }
      if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
        pAVar6 = Abc_NtkToNetlist(pNtk->pExdc);
        pNtk_00->pExdc = pAVar6;
      }
      iVar1 = Abc_NtkCheck(pNtk_00);
      if (iVar1 == 0) {
        fprintf(_stdout,"Abc_NtkLogicToNetlist(): Network check has failed.\n");
      }
      return pNtk_00;
    }
    pAVar3 = Abc_NtkCo(pNtk,local_3c);
    pAVar5 = Abc_ObjFanin0(pAVar3);
    iVar1 = Abc_ObjIsCi(pAVar5);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsNode(pAVar5);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(pDriver)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNetlist.c"
                      ,0xc1,"Abc_Ntk_t *Abc_NtkLogicToNetlist(Abc_Ntk_t *)");
      }
      if ((((pAVar5->field_6).pCopy)->field_6).pTemp == (void *)0x0) {
        pcVar2 = Abc_ObjName(pAVar3);
        pFanin_00 = Abc_NtkFindOrCreateNet(pNtk_00,pcVar2);
        Abc_ObjAddFanin((pAVar3->field_6).pCopy,pFanin_00);
        Abc_ObjAddFanin(pFanin_00,(pAVar5->field_6).pCopy);
        *(Abc_Obj_t **)((long)(pAVar5->field_6).pTemp + 0x40) = pFanin_00;
      }
      else {
        pcVar2 = Abc_ObjName((((pAVar5->field_6).pCopy)->field_6).pCopy);
        pcVar4 = Abc_ObjName(pAVar3);
        iVar1 = strcmp(pcVar2,pcVar4);
        if (iVar1 != 0) {
          __assert_fail("!strcmp( Abc_ObjName(pDriver->pCopy->pCopy), Abc_ObjName(pObj) )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNetlist.c"
                        ,0xce,"Abc_Ntk_t *Abc_NtkLogicToNetlist(Abc_Ntk_t *)");
        }
        Abc_ObjAddFanin((pAVar3->field_6).pCopy,(((pAVar5->field_6).pCopy)->field_6).pCopy);
      }
    }
    else {
      pcVar2 = Abc_ObjName(pAVar5);
      pcVar4 = Abc_ObjName(pAVar3);
      iVar1 = strcmp(pcVar2,pcVar4);
      if (iVar1 != 0) {
        __assert_fail("!strcmp( Abc_ObjName(pDriver), Abc_ObjName(pObj) )",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNetlist.c"
                      ,0xbd,"Abc_Ntk_t *Abc_NtkLogicToNetlist(Abc_Ntk_t *)");
      }
      Abc_ObjAddFanin((pAVar3->field_6).pCopy,(((pAVar5->field_6).pCopy)->field_6).pCopy);
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkLogicToNetlist( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pNet, * pDriver, * pFanin;
    int i, k;

    assert( Abc_NtkIsLogic(pNtk) );

    // remove dangling nodes
    Abc_NtkCleanup( pNtk, 0 );

    // make sure the CO names are unique
    Abc_NtkCheckUniqueCiNames( pNtk );
    Abc_NtkCheckUniqueCoNames( pNtk );
    Abc_NtkCheckUniqueCioNames( pNtk );

//    assert( Abc_NtkLogicHasSimpleCos(pNtk) );
    if ( !Abc_NtkLogicHasSimpleCos(pNtk) )
    {
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Abc_NtkLogicToNetlist() warning: The network is converted to have simple COs.\n" );
        Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
    }

    // start the netlist by creating PI/PO/Latch objects
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_NETLIST, pNtk->ntkFunc );
    // create the CI nets and remember them in the new CI nodes
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        pNet = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pObj) );
        Abc_ObjAddFanin( pNet, pObj->pCopy );
        pObj->pCopy->pCopy = pNet;
    }
    // duplicate all nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_NtkDupObj(pNtkNew, pObj, 0);
    // first add the nets to the CO drivers
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        if ( Abc_ObjIsCi(pDriver) )
        {
            assert( !strcmp( Abc_ObjName(pDriver), Abc_ObjName(pObj) ) );
            Abc_ObjAddFanin( pObj->pCopy, pDriver->pCopy->pCopy );
            continue;
        }
        assert( Abc_ObjIsNode(pDriver) );
        // if the CO driver has no net, create it
        if ( pDriver->pCopy->pCopy == NULL )
        {
            // create the CO net and connect it to CO
            pNet = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pObj) );
            Abc_ObjAddFanin( pObj->pCopy, pNet );
            // connect the CO net to the new driver and remember it in the new driver
            Abc_ObjAddFanin( pNet, pDriver->pCopy );
            pDriver->pCopy->pCopy = pNet;
        }
        else
        {
            assert( !strcmp( Abc_ObjName(pDriver->pCopy->pCopy), Abc_ObjName(pObj) ) );
            Abc_ObjAddFanin( pObj->pCopy, pDriver->pCopy->pCopy );
        }
    }
    // create the missing nets
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( pObj->pCopy->pCopy ) // the net of the new object is already created
            continue;
        // create the new net
        pNet = Abc_NtkFindOrCreateNet( pNtkNew, Abc_ObjName(pObj) ); // here we create ridiculous names net line "n48", where 48 is the ID of the node
        Abc_ObjAddFanin( pNet, pObj->pCopy );
        pObj->pCopy->pCopy = pNet;
    }
    // connect nodes to the fanins nets
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy->pCopy );
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkNew->pExdc = Abc_NtkToNetlist( pNtk->pExdc );
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkLogicToNetlist(): Network check has failed.\n" );
    return pNtkNew;
}